

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix.c
# Opt level: O1

int enet_socket_get_option(ENetSocket socket,ENetSocketOption option,int *value)

{
  int iVar1;
  int __level;
  socklen_t len;
  socklen_t local_4;
  
  if (option == ENET_SOCKOPT_TTL) {
    __level = 0;
    iVar1 = 2;
  }
  else {
    iVar1 = -1;
    if (option != ENET_SOCKOPT_ERROR) goto LAB_00107eff;
    __level = 1;
    iVar1 = 4;
  }
  iVar1 = getsockopt(socket,__level,iVar1,value,&local_4);
LAB_00107eff:
  return -(uint)(iVar1 == -1);
}

Assistant:

int
enet_socket_get_option (ENetSocket socket, ENetSocketOption option, int * value)
{
    int result = -1;
    socklen_t len;
    switch (option)
    {
        case ENET_SOCKOPT_ERROR:
            len = sizeof (int);
            result = getsockopt (socket, SOL_SOCKET, SO_ERROR, value, & len);
            break;

        case ENET_SOCKOPT_TTL:
            len = sizeof (int);
            result = getsockopt (socket, IPPROTO_IP, IP_TTL, (char *) value, & len);
            break;

        default:
            break;
    }
    return result == -1 ? -1 : 0;
}